

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov4.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  float *pfVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  pointer pOVar5;
  char cVar6;
  uint uVar7;
  int iVar8;
  char *pcVar9;
  long lVar10;
  char *__haystack;
  int iVar11;
  ulong uVar12;
  int i;
  long lVar13;
  __m128 t_2;
  __m128 t;
  allocator local_34d;
  int baseLine;
  undefined1 local_348 [8];
  undefined8 uStack_340;
  Size local_338;
  undefined8 uStack_330;
  double local_320;
  Size label_size;
  float mean_vals [3];
  vector<Object,_std::allocator<Object>_> objects;
  float norm_vals [3];
  int local_2d0;
  int local_2cc;
  int local_2c8;
  int local_2c4;
  int local_2c0;
  int local_2bc;
  Extractor ex;
  Mat out;
  VideoCapture cap;
  Mat frame;
  int local_1e0;
  int local_1dc;
  uchar *local_1d8;
  Mat in;
  Net yolov4;
  
  cv::Mat::Mat(&frame);
  objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  cv::VideoCapture::VideoCapture(&cap);
  ncnn::Net::Net(&yolov4);
  if (argc < 2) {
    __haystack = *argv;
    pcVar9 = "Usage: %s [v4l input device or image]\n";
LAB_0013ab6b:
    fprintf(_stderr,pcVar9,__haystack);
  }
  else {
    __haystack = argv[1];
    dVar2 = ncnn::get_current_time();
    yolov4.opt.num_threads = 4;
    yolov4.opt.use_vulkan_compute = true;
    yolov4.opt.use_winograd_convolution = true;
    yolov4.opt.use_sgemm_convolution = true;
    yolov4.opt.use_fp16_packed = true;
    yolov4.opt.use_fp16_storage = true;
    yolov4.opt.use_fp16_arithmetic = true;
    yolov4.opt.use_packing_layout = true;
    yolov4.opt.use_shader_pack8 = false;
    yolov4.opt.use_image_storage = false;
    uVar7 = ncnn::Net::load_param(&yolov4,"yolov4-tiny-opt.param");
    if ((uVar7 == 0) && (uVar7 = ncnn::Net::load_model(&yolov4,"yolov4-tiny-opt.bin"), uVar7 == 0))
    {
      dVar3 = ncnn::get_current_time();
      fprintf(_stdout,"NCNN Init time %.02lfms\n",SUB84(dVar3 - dVar2,0));
      pcVar9 = strstr(__haystack,"/dev/video");
      if (pcVar9 == (char *)0x0) {
        std::__cxx11::string::string((string *)&out,argv[1],(allocator *)local_348);
        cv::imread((string *)&in,(int)&out);
        cv::Mat::operator=(&frame,(Mat *)&in);
        cv::Mat::~Mat((Mat *)&in);
        std::__cxx11::string::~string((string *)&out);
        cVar6 = cv::Mat::empty();
        if (cVar6 == '\0') goto LAB_0013abc4;
        __haystack = argv[1];
        pcVar9 = "Failed to read image %s.\n";
      }
      else {
        std::__cxx11::string::string((string *)&in,__haystack,(allocator *)&out);
        cv::VideoCapture::open((string *)&cap,(int)&in);
        std::__cxx11::string::~string((string *)&in);
        cVar6 = cv::VideoCapture::isOpened();
        if (cVar6 == '\0') {
          pcVar9 = "Failed to open %s";
        }
        else {
          cv::VideoCapture::operator>>(&cap,&frame);
          cVar6 = cv::Mat::empty();
          if (cVar6 == '\0') {
            do {
              dVar2 = ncnn::get_current_time();
              cv::VideoCapture::operator>>(&cap,&frame);
              dVar3 = ncnn::get_current_time();
              fprintf(_stdout,"NCNN OpenCV capture time %.02lfms\n",SUB84(dVar3 - dVar2,0));
              cVar6 = cv::Mat::empty();
              if (cVar6 != '\0') {
                pcVar9 = "OpenCV Failed to Capture from device %s\n";
                goto LAB_0013ab6b;
              }
LAB_0013abc4:
              dVar2 = ncnn::get_current_time();
              ncnn::Mat::from_pixels_resize
                        (&in,local_1d8,0x10002,local_1dc,local_1e0,0x1a0,0x1a0,(Allocator *)0x0);
              stack0xfffffffffffffcf8 = (Mat *)((ulong)stack0xfffffffffffffcf8 & 0xffffffff00000000)
              ;
              mean_vals[0] = 0.0;
              mean_vals[1] = 0.0;
              norm_vals[0] = 0.003921569;
              norm_vals[1] = 0.003921569;
              norm_vals[2] = 0.003921569;
              ncnn::Mat::substract_mean_normalize(&in,mean_vals,norm_vals);
              ncnn::Net::create_extractor((Net *)&ex);
              ncnn::Extractor::input(&ex,"data",&in);
              out.cstep = 0;
              out.data = (void *)0x0;
              out.refcount._0_4_ = 0;
              out.refcount._4_4_ = 0;
              out.elemsize._0_4_ = 0;
              out.elemsize._4_4_ = 0;
              out.elempack = 0;
              out.allocator = (Allocator *)0x0;
              out.dims = 0;
              out.w = 0;
              out.h = 0;
              out.d = 0;
              out.c = 0;
              ncnn::Extractor::extract(&ex,"output",&out,0);
              if (objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                  super__Vector_impl_data._M_finish !=
                  objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                  super__Vector_impl_data._M_start) {
                objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                     super__Vector_impl_data._M_start;
              }
              local_320 = (double)CONCAT44(local_320._4_4_,(float)local_1e0);
              for (lVar13 = 0; lVar13 < out.h; lVar13 = lVar13 + 1) {
                lVar10 = out.w * lVar13 * CONCAT44(out.elemsize._4_4_,(undefined4)out.elemsize);
                local_338.height = (int)*(float *)((long)out.data + lVar10 + 4);
                local_338.width = (int)*(float *)((long)out.data + lVar10);
                local_348._0_4_ = *(float *)((long)out.data + lVar10 + 8) * (float)local_1dc;
                local_348._4_4_ = *(float *)((long)out.data + lVar10 + 0xc) * local_320._0_4_;
                uStack_340 = (Mat *)CONCAT44(*(float *)((long)out.data + lVar10 + 0x14) *
                                             local_320._0_4_ - (float)local_348._4_4_,
                                             *(float *)((long)out.data + lVar10 + 0x10) *
                                             (float)local_1dc - (float)local_348._0_4_);
                std::vector<Object,_std::allocator<Object>_>::push_back
                          (&objects,(value_type *)local_348);
              }
              ncnn::Mat::~Mat(&out);
              ncnn::Extractor::~Extractor(&ex);
              ncnn::Mat::~Mat(&in);
              dVar3 = ncnn::get_current_time();
              fprintf(_stdout,"NCNN detection time %.02lfms\n",SUB84(dVar3 - dVar2,0));
              local_320 = ncnn::get_current_time();
              cv::Mat::clone();
              lVar13 = 0;
              for (uVar12 = 0;
                  pOVar5 = objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                           super__Vector_impl_data._M_start,
                  uVar12 < (ulong)(((long)objects.
                                          super__Vector_base<Object,_std::allocator<Object>_>.
                                          _M_impl.super__Vector_impl_data._M_finish -
                                   (long)objects.super__Vector_base<Object,_std::allocator<Object>_>
                                         ._M_impl.super__Vector_impl_data._M_start) / 0x18);
                  uVar12 = uVar12 + 1) {
                fprintf(_stderr,"%d = %.5f at %.2f %.2f %.2f x %.2f\n",
                        SUB84((double)*(float *)((long)&(objects.
                                                  super__Vector_base<Object,_std::allocator<Object>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->prob +
                                                lVar13),0),
                        (double)*(float *)((long)&((objects.
                                                  super__Vector_base<Object,_std::allocator<Object>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->rect).
                                                  x + lVar13),
                        (double)*(float *)((long)&((objects.
                                                  super__Vector_base<Object,_std::allocator<Object>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->rect).
                                                  y + lVar13),
                        (double)*(float *)((long)&((objects.
                                                  super__Vector_base<Object,_std::allocator<Object>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->rect).
                                                  width + lVar13),
                        (double)*(float *)((long)&((objects.
                                                  super__Vector_base<Object,_std::allocator<Object>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->rect).
                                                  height + lVar13),
                        (ulong)*(uint *)((long)&(objects.
                                                 super__Vector_base<Object,_std::allocator<Object>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->label +
                                        lVar13));
                local_338.width = 0;
                local_338.height = 0;
                local_348._0_4_ = 3.7909693e-37;
                pfVar1 = (float *)((long)&(pOVar5->rect).x + lVar13);
                norm_vals[2] = (float)(int)ROUND(pfVar1[2]);
                norm_vals[1] = (float)(int)ROUND(pfVar1[1]);
                norm_vals[0] = (float)(int)ROUND(*pfVar1);
                uStack_340 = &out;
                cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)&in);
                in.data = (void *)0x406fe00000000000;
                in.refcount = (int *)0x0;
                in.elemsize = 0;
                in.elempack = 0;
                in._28_4_ = 0;
                cv::rectangle((string *)local_348,norm_vals,&in,1,8,0);
                sprintf((char *)&in,"%s %.1f%%",
                        SUB84((double)(*(float *)((long)&pOVar5->prob + lVar13) * 100.0),0),
                        _ZZL12draw_objectsRKN2cv3MatERKSt6vectorI6ObjectSaIS4_EEiE11class_names_rel
                        + *(int *)(
                                  _ZZL12draw_objectsRKN2cv3MatERKSt6vectorI6ObjectSaIS4_EEiE11class_names_rel
                                  + (long)*(int *)((long)&pOVar5->label + lVar13) * 4));
                baseLine = 0;
                std::__cxx11::string::string((string *)local_348,(char *)&in,(allocator *)mean_vals)
                ;
                cv::getTextSize((string *)&label_size,(int)(string *)local_348,0.5,0,(int *)0x1);
                std::__cxx11::string::~string((string *)local_348);
                iVar8 = (int)*(float *)((long)&(pOVar5->rect).x + lVar13);
                iVar11 = (int)((*(float *)((long)&(pOVar5->rect).y + lVar13) -
                               (float)label_size.height) - (float)baseLine);
                if (iVar11 < 1) {
                  iVar11 = 0;
                }
                iVar4 = out.refcount._4_4_ - label_size.width;
                if (label_size.width + iVar8 <= out.refcount._4_4_) {
                  iVar4 = iVar8;
                }
                mean_vals[0] = 3.7909693e-37;
                local_2bc = baseLine + label_size.height;
                local_2c0 = label_size.width;
                unique0x10000eac = &out;
                local_2c8 = iVar4;
                local_2c4 = iVar11;
                cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)local_348);
                local_348 = (undefined1  [8])0x406fe00000000000;
                uStack_340 = (Mat *)0x406fe00000000000;
                local_338.width = 0;
                local_338.height = 0x406fe000;
                uStack_330 = 0;
                cv::rectangle(mean_vals,&local_2c8,(string *)local_348,0xffffffffffffffff,8,0);
                mean_vals[0] = 3.7909693e-37;
                unique0x10000eb4 = &out;
                std::__cxx11::string::string((string *)local_348,(char *)&in,&local_34d);
                local_2cc = iVar11 + label_size.height;
                local_2d0 = iVar4;
                cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)&ex);
                ex._vptr_Extractor = (_func_int **)0x0;
                ex.d = (ExtractorPrivate *)0x0;
                cv::putText(0,mean_vals,(string *)local_348,&local_2d0,0,&ex,1,8,0);
                std::__cxx11::string::~string((string *)local_348);
                lVar13 = lVar13 + 0x18;
              }
              std::__cxx11::string::string((string *)&in,"image",(allocator *)mean_vals);
              local_338.width = 0;
              local_338.height = 0;
              local_348._0_4_ = 2.3693558e-38;
              uStack_340 = &out;
              cv::imshow((string *)&in,(_InputArray *)local_348);
              std::__cxx11::string::~string((string *)&in);
              cv::waitKey((uint)(pcVar9 != (char *)0x0));
              cv::Mat::~Mat((Mat *)&out);
              dVar2 = ncnn::get_current_time();
              fprintf(_stdout,"NCNN OpenCV draw result time %.02lfms\n",SUB84(dVar2 - local_320,0));
            } while (pcVar9 != (char *)0x0);
            iVar8 = 0;
            goto LAB_0013ab23;
          }
          pcVar9 = "Failed to read from device %s.\n";
        }
      }
      goto LAB_0013ab6b;
    }
    fprintf(_stderr,"Failed to load model or param, error %d",(ulong)uVar7);
  }
  iVar8 = -1;
LAB_0013ab23:
  ncnn::Net::~Net(&yolov4);
  cv::VideoCapture::~VideoCapture(&cap);
  std::_Vector_base<Object,_std::allocator<Object>_>::~_Vector_base
            (&objects.super__Vector_base<Object,_std::allocator<Object>_>);
  cv::Mat::~Mat(&frame);
  return iVar8;
}

Assistant:

int main(int argc, char** argv)
{
    cv::Mat frame;
    std::vector<Object> objects;

    cv::VideoCapture cap;

    ncnn::Net yolov4;

    const char* devicepath;

    int target_size = 0;
    int is_streaming = 0;

    if (argc < 2)
    {
        fprintf(stderr, "Usage: %s [v4l input device or image]\n", argv[0]);
        return -1;
    }

    devicepath = argv[1];

#ifdef NCNN_PROFILING
    double t_load_start = ncnn::get_current_time();
#endif

    int ret = init_yolov4(&yolov4, &target_size); //We load model and param first!
    if (ret != 0)
    {
        fprintf(stderr, "Failed to load model or param, error %d", ret);
        return -1;
    }

#ifdef NCNN_PROFILING
    double t_load_end = ncnn::get_current_time();
    fprintf(stdout, "NCNN Init time %.02lfms\n", t_load_end - t_load_start);
#endif

    if (strstr(devicepath, "/dev/video") == NULL)
    {
        frame = cv::imread(argv[1], 1);
        if (frame.empty())
        {
            fprintf(stderr, "Failed to read image %s.\n", argv[1]);
            return -1;
        }
    }
    else
    {
        cap.open(devicepath);

        if (!cap.isOpened())
        {
            fprintf(stderr, "Failed to open %s", devicepath);
            return -1;
        }

        cap >> frame;

        if (frame.empty())
        {
            fprintf(stderr, "Failed to read from device %s.\n", devicepath);
            return -1;
        }

        is_streaming = 1;
    }

    while (1)
    {
        if (is_streaming)
        {
#ifdef NCNN_PROFILING
            double t_capture_start = ncnn::get_current_time();
#endif

            cap >> frame;

#ifdef NCNN_PROFILING
            double t_capture_end = ncnn::get_current_time();
            fprintf(stdout, "NCNN OpenCV capture time %.02lfms\n", t_capture_end - t_capture_start);
#endif
            if (frame.empty())
            {
                fprintf(stderr, "OpenCV Failed to Capture from device %s\n", devicepath);
                return -1;
            }
        }

#ifdef NCNN_PROFILING
        double t_detect_start = ncnn::get_current_time();
#endif

        detect_yolov4(frame, objects, target_size, &yolov4); //Create an extractor and run detection

#ifdef NCNN_PROFILING
        double t_detect_end = ncnn::get_current_time();
        fprintf(stdout, "NCNN detection time %.02lfms\n", t_detect_end - t_detect_start);
#endif

#ifdef NCNN_PROFILING
        double t_draw_start = ncnn::get_current_time();
#endif

        draw_objects(frame, objects, is_streaming); //Draw detection results on opencv image

#ifdef NCNN_PROFILING
        double t_draw_end = ncnn::get_current_time();
        fprintf(stdout, "NCNN OpenCV draw result time %.02lfms\n", t_draw_end - t_draw_start);
#endif

        if (!is_streaming)
        {   //If it is a still image, exit!
            return 0;
        }
    }

    return 0;
}